

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O3

If_LibLut_t * If_LibLutRead(char *FileName)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  FILE *__stream;
  If_LibLut_t *__ptr;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  ulong uVar6;
  float (*pafVar7) [33];
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  char pBuffer [1000];
  char local_418 [1000];
  
  __stream = fopen(FileName,"r");
  if (__stream == (FILE *)0x0) {
    __ptr = (If_LibLut_t *)0x0;
    Abc_Print(-1,"Cannot open LUT library file \"%s\".\n",FileName);
  }
  else {
    __ptr = (If_LibLut_t *)calloc(1,0x1198);
    if (FileName == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar4 = strlen(FileName);
      __dest = (char *)malloc(sVar4 + 1);
      strcpy(__dest,FileName);
    }
    __ptr->pName = __dest;
    pcVar5 = fgets(local_418,1000,__stream);
    if (pcVar5 == (char *)0x0) {
      __ptr->LutMax = 0;
    }
    else {
      pafVar7 = __ptr->pLutDelays + 1;
      uVar9 = 1;
      bVar2 = false;
      do {
        pcVar5 = strtok(local_418," \t\n");
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '#')) {
          pcVar5 = fgets(local_418,1000,__stream);
        }
        else {
          uVar3 = atoi(pcVar5);
          if (uVar9 != uVar3) {
            Abc_Print(1,"Error in the LUT library file \"%s\".\n",FileName);
            if (__dest != (char *)0x0) {
              free(__dest);
            }
            free(__ptr);
            fclose(__stream);
            return (If_LibLut_t *)0x0;
          }
          pcVar5 = strtok((char *)0x0," \t\n");
          dVar11 = atof(pcVar5);
          __ptr->pLutAreas[uVar9] = (float)dVar11;
          pcVar5 = strtok((char *)0x0," \t\n");
          if (pcVar5 != (char *)0x0) {
            lVar8 = 0;
            uVar10 = 0;
            do {
              lVar8 = lVar8 + 0x100000000;
              dVar11 = atof(pcVar5);
              (*pafVar7)[uVar10] = (float)dVar11;
              uVar10 = uVar10 + 1;
              pcVar5 = strtok((char *)0x0," \t\n");
            } while (pcVar5 != (char *)0x0);
            if ((long)uVar9 < lVar8 >> 0x20) {
              if (__dest != (char *)0x0) {
                free(__dest);
              }
              free(__ptr);
              Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",uVar9 & 0xffffffff,
                        uVar10 & 0xffffffff,uVar9 & 0xffffffff);
              goto LAB_00402138;
            }
            if (uVar10 != 1) {
              __ptr->fVarPinDelays = 1;
              bVar2 = true;
            }
          }
          if (uVar9 == 0x20) {
            if (__dest != (char *)0x0) {
              free(__dest);
            }
            free(__ptr);
            Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
LAB_00402138:
            fclose(__stream);
            return (If_LibLut_t *)0x0;
          }
          uVar9 = uVar9 + 1;
          pcVar5 = fgets(local_418,1000,__stream);
          pafVar7 = pafVar7 + 1;
        }
      } while (pcVar5 != (char *)0x0);
      __ptr->LutMax = (int)uVar9 + -1;
      if (bVar2) {
        if (1 < (long)uVar9) {
          pafVar7 = __ptr->pLutDelays;
          uVar10 = 1;
          do {
            pafVar7 = pafVar7 + 1;
            uVar6 = 0;
            do {
              fVar1 = (*pafVar7)[uVar6];
              if (fVar1 <= 0.0) {
                Abc_Print(0,
                          "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                          ,(double)fVar1,uVar6 & 0xffffffff,uVar10 & 0xffffffff);
              }
              if ((uVar6 != 0) && (fVar1 < pafVar7[-1][uVar6 + 0x20])) {
                Abc_Print(0,
                          "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                          ,(double)pafVar7[-1][uVar6 + 0x20],(double)fVar1,(ulong)((int)uVar6 - 1),
                          uVar10 & 0xffffffff,uVar6 & 0xffffffff,uVar10 & 0xffffffff);
              }
              uVar6 = uVar6 + 1;
            } while (uVar10 != uVar6);
            uVar10 = uVar10 + 1;
          } while (uVar10 != (uVar9 & 0xffffffff));
        }
      }
      else if (1 < (long)uVar9) {
        pafVar7 = __ptr->pLutDelays;
        uVar10 = 1;
        do {
          pafVar7 = pafVar7 + 1;
          if ((*pafVar7)[0] <= 0.0) {
            Abc_Print(0,
                      "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)(*pafVar7)[0],uVar10 & 0xffffffff);
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

If_LibLut_t * If_LibLutRead( char * FileName )
{
    char pBuffer[1000], * pToken;
    If_LibLut_t * p;
    FILE * pFile;
    int i, k;

    pFile = fopen( FileName, "r" );
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open LUT library file \"%s\".\n", FileName );
        return NULL;
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );
    p->pName = Abc_UtilStrsav( FileName );

    i = 1;
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library file \"%s\".\n", FileName );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            fclose( pFile );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            fclose( pFile );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            fclose( pFile );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    fclose( pFile );
    return p;
}